

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Regexp * __thiscall
re2::Regexp::Walker<re2::Regexp_*>::WalkInternal
          (Walker<re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *psVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar6;
  ulong uVar7;
  void *pvVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar9;
  WalkState<re2::Regexp_*> local_248;
  Regexp **local_218;
  Regexp **sub;
  Regexp *pRStack_208;
  bool stop;
  Regexp *re_1;
  Regexp *t;
  WalkState<re2::Regexp_*> *s;
  LogMessage local_1b0;
  byte local_29;
  Regexp *pRStack_28;
  bool use_copy_local;
  Regexp *top_arg_local;
  Regexp *re_local;
  Walker<re2::Regexp_*> *this_local;
  int extraout_var_00;
  
  local_29 = use_copy;
  pRStack_28 = top_arg;
  top_arg_local = re;
  re_local = (Regexp *)this;
  Reset(this);
  if (top_arg_local == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    poVar5 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar5,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    return pRStack_28;
  }
  psVar1 = this->stack_;
  WalkState<re2::Regexp_*>::WalkState((WalkState<re2::Regexp_*> *)&s,top_arg_local,pRStack_28);
  std::
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  ::push(psVar1,(value_type *)&s);
  do {
    while( true ) {
      t = (Regexp *)
          std::
          stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
          ::top(this->stack_);
      pRStack_208 = ((reference)t)->re;
      if (((reference)t)->n != -1) break;
      iVar4 = this->max_visits_ + -1;
      this->max_visits_ = iVar4;
      if (iVar4 < 0) {
        this->stopped_early_ = true;
        iVar4 = (*this->_vptr_Walker[5])(this,pRStack_208,((reference)t)->parent_arg);
        re_1 = (Regexp *)CONCAT44(extraout_var,iVar4);
      }
      else {
        sub._7_1_ = 0;
        aVar6.max_ = (*this->_vptr_Walker[2])
                               (this,pRStack_208,((reference)t)->parent_arg,(long)&sub + 7);
        aVar6.min_ = extraout_var_00;
        (t->field_7).field_0 = aVar6;
        if ((sub._7_1_ & 1) == 0) {
          *(undefined4 *)&t->field_5 = 0;
          t[1].op_ = '\0';
          t[1].simple_ = '\0';
          t[1].parse_flags_ = 0;
          t[1].ref_ = 0;
          t[1].nsub_ = 0;
          if (pRStack_208->nsub_ == 1) {
            *(undefined1 **)(t + 1) = (undefined1 *)((long)&t->field_7 + 8);
          }
          else if (1 < pRStack_208->nsub_) {
            auVar3 = ZEXT216(pRStack_208->nsub_) * ZEXT816(8);
            uVar7 = auVar3._0_8_;
            if (auVar3._8_8_ != 0) {
              uVar7 = 0xffffffffffffffff;
            }
            pvVar8 = operator_new__(uVar7);
            *(void **)(t + 1) = pvVar8;
          }
          break;
        }
        re_1 = (Regexp *)(t->field_7).field_3.cc_;
      }
LAB_0017beea:
      std::
      stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
      ::pop(this->stack_);
      sVar9 = std::
              stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
              ::size(this->stack_);
      if (sVar9 == 0) {
        return re_1;
      }
      t = (Regexp *)
          std::
          stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
          ::top(this->stack_);
      if (((reference)t)->child_args == (Regexp **)0x0) {
        ((reference)t)->child_arg = re_1;
      }
      else {
        ((reference)t)->child_args[((reference)t)->n] = re_1;
      }
      ((reference)t)->n = ((reference)t)->n + 1;
    }
    if ((pRStack_208->nsub_ == 0) ||
       (local_218 = Regexp::sub(pRStack_208), (int)(uint)pRStack_208->nsub_ <= *(int *)&t->field_5))
    {
      uVar2._0_1_ = t[1].op_;
      uVar2._1_1_ = t[1].simple_;
      uVar2._2_2_ = t[1].parse_flags_;
      uVar2._4_2_ = t[1].ref_;
      uVar2._6_2_ = t[1].nsub_;
      iVar4 = (*this->_vptr_Walker[3])
                        (this,pRStack_208,t->down_,(t->field_7).field_3.cc_,uVar2,
                         (ulong)*(uint *)&t->field_5);
      re_1 = (Regexp *)CONCAT44(extraout_var_02,iVar4);
      if ((1 < pRStack_208->nsub_) && (*(void **)(t + 1) != (void *)0x0)) {
        operator_delete__(*(void **)(t + 1));
      }
      goto LAB_0017beea;
    }
    if (((local_29 & 1) == 0) ||
       ((*(int *)&t->field_5 < 1 ||
        (local_218[*(int *)&t->field_5 + -1] != local_218[*(int *)&t->field_5])))) {
      psVar1 = this->stack_;
      WalkState<re2::Regexp_*>::WalkState
                (&local_248,local_218[*(int *)&t->field_5],(Regexp *)(t->field_7).field_3.cc_);
      std::
      stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
      ::push(psVar1,&local_248);
    }
    else {
      iVar4 = (*this->_vptr_Walker[4])
                        (this,*(undefined8 *)
                               (*(long *)(t + 1) + (long)(*(int *)&t->field_5 + -1) * 8));
      *(ulong *)(*(long *)(t + 1) + (long)*(int *)&t->field_5 * 8) = CONCAT44(extraout_var_01,iVar4)
      ;
      *(int *)&t->field_5 = *(int *)&t->field_5 + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}